

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O1

int __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::sufheadcheck(SOLReader2<mp::SOLHandler_Easy> *this,SufRead *sr)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  
  uVar1 = (sr->h).kind;
  iVar4 = 1;
  if ((((-1 < (int)uVar1) && ((int)uVar1 < 0x10)) && (-1 < (sr->h).n)) &&
     (((iVar2 = (sr->h).namelen, 1 < iVar2 && (iVar3 = (sr->h).tablen, -1 < iVar3)) &&
      ((this->i = uVar1 & 3, iVar3 == 0 || (0 < sr->tablines && sr->tablines <= iVar3 + 1)))))) {
    std::vector<char,_std::allocator<char>_>::resize(&sr->xp,(ulong)(iVar3 + iVar2 * 2 + 6));
    pcVar5 = (sr->xp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sr->name = pcVar5;
    pcVar5 = pcVar5 + (sr->h).namelen;
    sr->table = pcVar5;
    sr->tabname = pcVar5 + (sr->h).tablen;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int SOLReader2<SOLHandler>::sufheadcheck(SufRead* sr) {
  int n;

  n = (int)sr->h.n;
  if (sr->h.kind < 0 || sr->h.kind > 15 || n < 0 || sr->h.namelen < 2
   || sr->h.tablen < 0)
    return 1;
  i = (int)sr->h.kind & 3;
  if (sr->h.tablen
   && (sr->tablines > sr->h.tablen + 1 || sr->tablines < 1))
    return 1;
  sr->xp.resize((sr->h.tablen + 2*sr->h.namelen + 6));
  sr->name = (char*)sr->xp.data();
  sr->table = sr->name + sr->h.namelen;
  sr->tabname = sr->table + sr->h.tablen;
  return 0;
}